

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O2

Instr * __thiscall IR::Instr::GetNextByteCodeInstr(Instr *this)

{
  code *pcVar1;
  bool bVar2;
  uint32 uVar3;
  uint32 uVar4;
  Instr *this_00;
  undefined4 *puVar5;
  Instr *in_RSI;
  
  this_00 = GetNextRealInstrOrLabel(this);
  uVar3 = GetByteCodeOffset(this);
  while ((uVar4 = GetByteCodeOffset(this_00), uVar4 == 0xffffffff ||
         (uVar4 = GetByteCodeOffset(this_00), uVar4 == uVar3))) {
    this_00 = GetNextByteCodeInstr::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)this_00,in_RSI);
  }
  if (uVar3 == 0xffffffff) {
    uVar3 = GetByteCodeOffset(this_00);
    if (uVar3 != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                         ,0xb27,"(nextInstr->GetByteCodeOffset() == 0)",
                         "Only instrs before the first one are allowed to not have a bytecode offset"
                        );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
    }
    return this_00;
  }
  while ((uVar4 = GetByteCodeOffset(this_00), uVar4 == 0xffffffff ||
         (uVar4 = GetByteCodeOffset(this_00), uVar4 < uVar3))) {
    this_00 = GetNextByteCodeInstr::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)this_00,in_RSI);
  }
  return this_00;
}

Assistant:

IR::Instr *
Instr::GetNextByteCodeInstr() const
{
    IR::Instr * nextInstr = GetNextRealInstrOrLabel();
    uint32 currentOffset = GetByteCodeOffset();
    const auto getNext = [](IR::Instr* nextInstr) -> IR::Instr*
    {
        if (nextInstr->IsBranchInstr())
        {
            IR::BranchInstr* branchInstr = nextInstr->AsBranchInstr();
            AssertMsg(branchInstr->IsUnconditional(), "We can't know which branch to take on a conditionnal branch");
            if (branchInstr->IsUnconditional())
            {
                return branchInstr->GetTarget();
            }
        }
        return nextInstr->GetNextRealInstrOrLabel();
    };
    while (nextInstr->GetByteCodeOffset() == Js::Constants::NoByteCodeOffset ||
        nextInstr->GetByteCodeOffset() == currentOffset)
    {
        nextInstr = getNext(nextInstr);
    }

    // Do not check if the instr trying to bailout is in the function prologue
    // nextInstr->GetByteCodeOffset() < currentOffset would always be true and we would crash
    if (currentOffset != Js::Constants::NoByteCodeOffset)
    {
        // This can happen due to break block removal
        while (nextInstr->GetByteCodeOffset() == Js::Constants::NoByteCodeOffset ||
            nextInstr->GetByteCodeOffset() < currentOffset)
        {
            nextInstr = getNext(nextInstr);
        }
    }
    else
    {
        AssertMsg(nextInstr->GetByteCodeOffset() == 0, "Only instrs before the first one are allowed to not have a bytecode offset");
    }
    return nextInstr;
}